

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O2

void __thiscall indk::NeuralNet::doInterlinkInit(NeuralNet *this,int port,int timeout)

{
  bool bVar1;
  Interlink *this_00;
  string local_80;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this_00 = (Interlink *)operator_new(0xa0);
  Interlink::Interlink(this_00,port,timeout);
  this->InterlinkService = this_00;
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(indk::NeuralNet_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/src/neuralnet/neuralnet.cpp:48:83)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(indk::NeuralNet_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/src/neuralnet/neuralnet.cpp:48:83)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  Profiler::doAttachCallback(this,1,(ProfilerCallback *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(indk::NeuralNet_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/src/neuralnet/neuralnet.cpp:58:88)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(indk::NeuralNet_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/src/neuralnet/neuralnet.cpp:58:88)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  Profiler::doAttachCallback(this,0,(ProfilerCallback *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  bVar1 = Interlink::isInterlinked(this->InterlinkService);
  if (bVar1) {
    Interlink::getStructure_abi_cxx11_(&local_80,this->InterlinkService);
    std::__cxx11::string::~string((string *)&local_80);
    if (local_80._M_string_length != 0) {
      Interlink::getStructure_abi_cxx11_(&local_80,this->InterlinkService);
      setStructure(this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  return;
}

Assistant:

void indk::NeuralNet::doInterlinkInit(int port, int timeout) {
    InterlinkService = new indk::Interlink(port, timeout);

    indk::Profiler::doAttachCallback(this, indk::Profiler::EventFlags::EventTick, [this](indk::NeuralNet *nn) {
        auto neurons = getNeurons();
        for (uint64_t i = 0; i < neurons.size(); i++) {
            if (i >= InterlinkDataBuffer.size()) {
                InterlinkDataBuffer.emplace_back();
            }
            InterlinkDataBuffer[i].push_back(std::to_string(neurons[i]->doSignalReceive().second));
        }
    });

    indk::Profiler::doAttachCallback(this, indk::Profiler::EventFlags::EventProcessed, [this](indk::NeuralNet *nn) {
        doInterlinkSyncData();
    });

    if (InterlinkService->isInterlinked()) {
        if (!InterlinkService->getStructure().empty()) setStructure(InterlinkService->getStructure());
    }
}